

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O1

bool TestLowbitsCollisions<unsigned_int>
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *revhashes)

{
  pointer puVar1;
  undefined1 auVar2 [16];
  byte bVar3;
  byte bVar4;
  uint __exponent;
  uint uVar5;
  ulong in_RCX;
  undefined8 uVar6;
  ulong uVar7;
  uint uVar8;
  int in_ESI;
  int nbHashes;
  uint uVar9;
  bool bVar10;
  ushort uVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  uint uVar20;
  double in_XMM0_Qa;
  double dVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  double local_48;
  
  nbHashes = (int)((ulong)((long)(revhashes->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(revhashes->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_start) >> 2);
  __exponent = FindMinBits_TargetCollisionShare(nbHashes,in_XMM0_Qa);
  uVar5 = FindMaxBits_TargetCollisionNb(nbHashes,in_ESI);
  bVar10 = true;
  if (0xffffffe0 < uVar5 - 0x20) {
    uVar8 = 0;
    printf("Testing collisions (low  %2i-%2i bits) - ",(ulong)__exponent,(ulong)uVar5);
    if ((int)uVar5 < (int)__exponent) {
      dVar22 = 0.0;
      uVar6 = 1;
      uVar9 = 0;
    }
    else {
      auVar24._0_8_ = (double)nbHashes;
      uVar9 = 0;
      dVar22 = 0.0;
      auVar13 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar14 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      local_48 = 1.0;
      uVar8 = 0;
      do {
        puVar1 = (revhashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar7 = (long)(revhashes->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2;
        uVar20 = 0;
        if (1 < uVar7) {
          in_RCX = uVar7 + 0xe & 0xfffffffffffffff0;
          auVar15 = vpbroadcastq_avx512f();
          auVar16 = vpbroadcastd_avx512f();
          auVar25 = ZEXT1664((undefined1  [16])0x0);
          uVar7 = 0;
          do {
            auVar17 = vpbroadcastq_avx512f();
            auVar18 = vporq_avx512f(auVar17,auVar13);
            auVar17 = vporq_avx512f(auVar17,auVar14);
            uVar6 = vpcmpuq_avx512f(auVar17,auVar15,2);
            bVar3 = (byte)uVar6;
            uVar6 = vpcmpuq_avx512f(auVar18,auVar15,2);
            bVar4 = (byte)uVar6;
            uVar11 = CONCAT11(bVar4,bVar3);
            auVar17 = vmovdqu32_avx512f(*(undefined1 (*) [64])(puVar1 + uVar7));
            auVar18._4_4_ = (uint)((byte)(uVar11 >> 1) & 1) * auVar17._4_4_;
            auVar18._0_4_ = (uint)(bVar3 & 1) * auVar17._0_4_;
            auVar18._8_4_ = (uint)((byte)(uVar11 >> 2) & 1) * auVar17._8_4_;
            auVar18._12_4_ = (uint)((byte)(uVar11 >> 3) & 1) * auVar17._12_4_;
            auVar18._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * auVar17._16_4_;
            auVar18._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * auVar17._20_4_;
            auVar18._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * auVar17._24_4_;
            auVar18._28_4_ = (uint)((byte)(uVar11 >> 7) & 1) * auVar17._28_4_;
            auVar18._32_4_ = (uint)(bVar4 & 1) * auVar17._32_4_;
            auVar18._36_4_ = (uint)(bVar4 >> 1 & 1) * auVar17._36_4_;
            auVar18._40_4_ = (uint)(bVar4 >> 2 & 1) * auVar17._40_4_;
            auVar18._44_4_ = (uint)(bVar4 >> 3 & 1) * auVar17._44_4_;
            auVar18._48_4_ = (uint)(bVar4 >> 4 & 1) * auVar17._48_4_;
            auVar18._52_4_ = (uint)(bVar4 >> 5 & 1) * auVar17._52_4_;
            auVar18._56_4_ = (uint)(bVar4 >> 6 & 1) * auVar17._56_4_;
            auVar18._60_4_ = (uint)(bVar4 >> 7) * auVar17._60_4_;
            auVar17 = vpsrlvd_avx512f(auVar18,auVar16);
            auVar18 = vmovdqu32_avx512f(*(undefined1 (*) [64])(puVar1 + uVar7 + 1));
            auVar19._4_4_ = (uint)((byte)(uVar11 >> 1) & 1) * auVar18._4_4_;
            auVar19._0_4_ = (uint)(bVar3 & 1) * auVar18._0_4_;
            auVar19._8_4_ = (uint)((byte)(uVar11 >> 2) & 1) * auVar18._8_4_;
            auVar19._12_4_ = (uint)((byte)(uVar11 >> 3) & 1) * auVar18._12_4_;
            auVar19._16_4_ = (uint)((byte)(uVar11 >> 4) & 1) * auVar18._16_4_;
            auVar19._20_4_ = (uint)((byte)(uVar11 >> 5) & 1) * auVar18._20_4_;
            auVar19._24_4_ = (uint)((byte)(uVar11 >> 6) & 1) * auVar18._24_4_;
            auVar19._28_4_ = (uint)((byte)(uVar11 >> 7) & 1) * auVar18._28_4_;
            auVar19._32_4_ = (uint)(bVar4 & 1) * auVar18._32_4_;
            auVar19._36_4_ = (uint)(bVar4 >> 1 & 1) * auVar18._36_4_;
            auVar19._40_4_ = (uint)(bVar4 >> 2 & 1) * auVar18._40_4_;
            auVar19._44_4_ = (uint)(bVar4 >> 3 & 1) * auVar18._44_4_;
            auVar19._48_4_ = (uint)(bVar4 >> 4 & 1) * auVar18._48_4_;
            auVar19._52_4_ = (uint)(bVar4 >> 5 & 1) * auVar18._52_4_;
            auVar19._56_4_ = (uint)(bVar4 >> 6 & 1) * auVar18._56_4_;
            auVar19._60_4_ = (uint)(bVar4 >> 7) * auVar18._60_4_;
            auVar18 = vpsrlvd_avx512f(auVar19,auVar16);
            auVar19 = vmovdqa64_avx512f(auVar25);
            uVar6 = vpcmpeqd_avx512f(auVar17,auVar18);
            auVar25 = vpmovm2d_avx512dq(uVar6);
            auVar25 = vpsubd_avx512f(auVar19,auVar25);
            uVar7 = uVar7 + 0x10;
          } while (in_RCX != uVar7);
          auVar13 = vmovdqa32_avx512f(auVar25);
          auVar14._0_4_ =
               (uint)(bVar3 & 1) * auVar13._0_4_ | (uint)!(bool)(bVar3 & 1) * auVar19._0_4_;
          bVar10 = (bool)((byte)(uVar11 >> 1) & 1);
          auVar14._4_4_ = (uint)bVar10 * auVar13._4_4_ | (uint)!bVar10 * auVar19._4_4_;
          bVar10 = (bool)((byte)(uVar11 >> 2) & 1);
          auVar14._8_4_ = (uint)bVar10 * auVar13._8_4_ | (uint)!bVar10 * auVar19._8_4_;
          bVar10 = (bool)((byte)(uVar11 >> 3) & 1);
          auVar14._12_4_ = (uint)bVar10 * auVar13._12_4_ | (uint)!bVar10 * auVar19._12_4_;
          bVar10 = (bool)((byte)(uVar11 >> 4) & 1);
          auVar14._16_4_ = (uint)bVar10 * auVar13._16_4_ | (uint)!bVar10 * auVar19._16_4_;
          bVar10 = (bool)((byte)(uVar11 >> 5) & 1);
          auVar14._20_4_ = (uint)bVar10 * auVar13._20_4_ | (uint)!bVar10 * auVar19._20_4_;
          bVar10 = (bool)((byte)(uVar11 >> 6) & 1);
          auVar14._24_4_ = (uint)bVar10 * auVar13._24_4_ | (uint)!bVar10 * auVar19._24_4_;
          bVar10 = (bool)((byte)(uVar11 >> 7) & 1);
          auVar14._28_4_ = (uint)bVar10 * auVar13._28_4_ | (uint)!bVar10 * auVar19._28_4_;
          auVar14._32_4_ =
               (uint)(bVar4 & 1) * auVar13._32_4_ | (uint)!(bool)(bVar4 & 1) * auVar19._32_4_;
          bVar10 = (bool)(bVar4 >> 1 & 1);
          auVar14._36_4_ = (uint)bVar10 * auVar13._36_4_ | (uint)!bVar10 * auVar19._36_4_;
          bVar10 = (bool)(bVar4 >> 2 & 1);
          auVar14._40_4_ = (uint)bVar10 * auVar13._40_4_ | (uint)!bVar10 * auVar19._40_4_;
          bVar10 = (bool)(bVar4 >> 3 & 1);
          auVar14._44_4_ = (uint)bVar10 * auVar13._44_4_ | (uint)!bVar10 * auVar19._44_4_;
          bVar10 = (bool)(bVar4 >> 4 & 1);
          auVar14._48_4_ = (uint)bVar10 * auVar13._48_4_ | (uint)!bVar10 * auVar19._48_4_;
          bVar10 = (bool)(bVar4 >> 5 & 1);
          auVar14._52_4_ = (uint)bVar10 * auVar13._52_4_ | (uint)!bVar10 * auVar19._52_4_;
          bVar10 = (bool)(bVar4 >> 6 & 1);
          auVar14._56_4_ = (uint)bVar10 * auVar13._56_4_ | (uint)!bVar10 * auVar19._56_4_;
          auVar14._60_4_ =
               (uint)(bVar4 >> 7) * auVar13._60_4_ | (uint)!(bool)(bVar4 >> 7) * auVar19._60_4_;
          auVar12 = vextracti64x4_avx512f(auVar14,1);
          auVar13 = vpaddd_avx512f(auVar14,ZEXT3264(auVar12));
          auVar23 = vpaddd_avx(auVar13._0_16_,auVar13._16_16_);
          auVar2 = vpshufd_avx(auVar23,0xee);
          auVar23 = vpaddd_avx(auVar23,auVar2);
          auVar2 = vpshufd_avx(auVar23,0x55);
          auVar23 = vpaddd_avx(auVar23,auVar2);
          uVar20 = auVar23._0_4_;
        }
        dVar21 = ldexp(1.0,__exponent);
        auVar23._0_8_ = (auVar24._0_8_ * (double)(nbHashes + -1)) / dVar21;
        auVar23._8_8_ = 0;
        auVar24._8_8_ = 0;
        auVar23 = vminsd_avx(auVar24,auVar23);
        dVar21 = (double)(int)uVar20 / auVar23._0_8_;
        if (dVar22 < dVar21) {
          uVar9 = uVar20;
          dVar22 = dVar21;
          local_48 = auVar23._0_8_;
          uVar8 = __exponent;
        }
        bVar10 = __exponent != uVar5;
        auVar13 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar14 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        __exponent = __exponent + 1;
      } while (bVar10);
      uVar6 = CONCAT44((int)(in_RCX >> 0x20),(int)local_48);
    }
    bVar10 = true;
    printf("Worst is %2i bits: %2i/%2i (%.2fx)",(ulong)uVar8,(ulong)uVar9,uVar6);
    if (2.0 < dVar22) {
      puts(" !!!!!");
      bVar10 = false;
    }
    else {
      putchar(10);
    }
  }
  return bVar10;
}

Assistant:

bool TestLowbitsCollisions ( std::vector<hashtype> & revhashes)
{
  int origBits = sizeof(hashtype) * 8;

  size_t const nbH = revhashes.size();
  int const minBits = FindMinBits_TargetCollisionShare(nbH, 0.01);
  int const maxBits = FindMaxBits_TargetCollisionNb(nbH, 20);
  if (maxBits <= 0 || maxBits >= origBits) return true;

  printf("Testing collisions (low  %2i-%2i bits) - ", minBits, maxBits);
  double maxCollDev = 0.0;
  int maxCollDevBits = 0;
  int maxCollDevNb = 0;
  double maxCollDevExp = 1.0;

  for (int b = minBits; b <= maxBits; b++) {
      int    const nbColls = CountNbCollisions(revhashes, b);
      double const expected = EstimateNbCollisions(nbH, b);
      assert(expected > 0.0);
      double const dev = (double)nbColls / expected;
      if (dev > maxCollDev) {
          maxCollDev = dev;
          maxCollDevBits = b;
          maxCollDevNb = nbColls;
          maxCollDevExp = expected;
      }
  }

  printf("Worst is %2i bits: %2i/%2i (%.2fx)",
        maxCollDevBits, maxCollDevNb, (int)maxCollDevExp, maxCollDev);

  if (maxCollDev > 2.0) {
    printf(" !!!!!\n");
    return false;
  }

  printf("\n");
  return true;
}